

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRec3.c
# Opt level: O0

Vec_Str_t * Lms_GiaAreas(Gia_Man_t *p)

{
  int iVar1;
  Vec_Str_t *p_00;
  Gia_Obj_t *pGVar2;
  bool bVar3;
  char local_3c;
  int local_24;
  Gia_Obj_t *pGStack_20;
  int i;
  Gia_Obj_t *pObj;
  Vec_Str_t *vAreas;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ManCoNum(p);
  p_00 = Vec_StrAlloc(iVar1);
  local_24 = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p->vCos);
    bVar3 = false;
    if (local_24 < iVar1) {
      pGStack_20 = Gia_ManCo(p,local_24);
      bVar3 = pGStack_20 != (Gia_Obj_t *)0x0;
    }
    if (!bVar3) break;
    pGVar2 = Gia_ObjFanin0(pGStack_20);
    iVar1 = Gia_ObjIsAnd(pGVar2);
    if (iVar1 == 0) {
      local_3c = '\0';
    }
    else {
      pGVar2 = Gia_ObjFanin0(pGStack_20);
      iVar1 = Lms_ObjArea(pGVar2);
      local_3c = (char)iVar1;
    }
    Vec_StrPush(p_00,local_3c);
    local_24 = local_24 + 1;
  }
  return p_00;
}

Assistant:

Vec_Str_t * Lms_GiaAreas( Gia_Man_t * p )
{
    Vec_Str_t * vAreas;
    Gia_Obj_t * pObj;
    int i;
    vAreas = Vec_StrAlloc( Gia_ManCoNum(p) );
    Gia_ManForEachCo( p, pObj, i )
        Vec_StrPush( vAreas, (char)(Gia_ObjIsAnd(Gia_ObjFanin0(pObj)) ? Lms_ObjArea(Gia_ObjFanin0(pObj)) : 0) );
    return vAreas;
}